

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_0000_0999.cpp
# Opt level: O0

void __thiscall psy::C::ParserTester::case0286(ParserTester *this)

{
  initializer_list<psy::C::SyntaxKind> __l;
  Expectation *pEVar1;
  LanguageExtensions *pLVar2;
  ParseOptions *pPVar3;
  LanguageExtensions local_268;
  anon_union_8_2_2d0bec1f_for_MacroTranslations_0 local_258;
  anon_union_8_2_2d0bec1f_for_LanguageExtensions_1 aStack_250;
  ParseOptions local_248;
  undefined8 local_228;
  anon_union_8_2_2d0bec1f_for_MacroTranslations_0 aStack_220;
  anon_union_8_2_2d0bec1f_for_LanguageExtensions_1 local_218;
  undefined8 uStack_210;
  allocator<psy::C::SyntaxKind> local_1f9;
  SyntaxKind local_1f8 [12];
  iterator local_1e0;
  size_type local_1d8;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1d0;
  Expectation local_1b8;
  Expectation local_100;
  allocator<char> local_31;
  string local_30;
  ParserTester *local_10;
  ParserTester *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"void x ( y ) struct z y ; { }",&local_31);
  Expectation::Expectation(&local_1b8);
  local_1f8[0] = STARTof_Node;
  local_1f8[1] = FunctionDefinition;
  local_1f8[2] = VoidTypeSpecifier;
  local_1f8[3] = FunctionDeclarator;
  local_1f8[4] = IdentifierDeclarator;
  local_1f8[5] = ParameterSuffix;
  local_1f8[6] = ParameterDeclaration;
  local_1f8[7] = IdentifierDeclarator;
  local_1f8[8] = ExtKR_ParameterDeclaration;
  local_1f8[9] = StructTypeSpecifier;
  local_1f8[10] = IdentifierDeclarator;
  local_1f8[0xb] = CompoundStatement;
  local_1e0 = local_1f8;
  local_1d8 = 0xc;
  std::allocator<psy::C::SyntaxKind>::allocator(&local_1f9);
  __l._M_len = local_1d8;
  __l._M_array = local_1e0;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            (&local_1d0,__l,&local_1f9);
  pEVar1 = Expectation::AST(&local_1b8,&local_1d0);
  Expectation::Expectation(&local_100,pEVar1);
  ParseOptions::ParseOptions(&local_248);
  LanguageExtensions::LanguageExtensions(&local_268);
  pLVar2 = LanguageExtensions::enable_extC_KandRStyle(&local_268,true);
  local_258 = (pLVar2->translations_).field_0;
  aStack_250 = pLVar2->field_1;
  pPVar3 = ParseOptions::withLanguageExtensions(&local_248,*pLVar2);
  local_228 = *(undefined8 *)pPVar3;
  aStack_220 = (pPVar3->langExts_).translations_.field_0;
  local_218 = (pPVar3->langExts_).field_1;
  uStack_210 = *(undefined8 *)&pPVar3->field_2;
  parse(this,&local_30,&local_100,Any,*pPVar3);
  Expectation::~Expectation(&local_100);
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~vector(&local_1d0);
  std::allocator<psy::C::SyntaxKind>::~allocator(&local_1f9);
  Expectation::~Expectation(&local_1b8);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void ParserTester::case0286()
{
    parse("void x ( y ) struct z y ; { }",
          Expectation().AST({ SyntaxKind::TranslationUnit,
                              SyntaxKind::FunctionDefinition,
                              SyntaxKind::VoidTypeSpecifier,
                              SyntaxKind::FunctionDeclarator,
                              SyntaxKind::IdentifierDeclarator,
                              SyntaxKind::ParameterSuffix,
                              SyntaxKind::ParameterDeclaration,
                              SyntaxKind::IdentifierDeclarator,
                              SyntaxKind::ExtKR_ParameterDeclaration,
                              SyntaxKind::StructTypeSpecifier,
                              SyntaxKind::IdentifierDeclarator,
                              SyntaxKind::CompoundStatement }),
          SyntaxTree::SyntaxCategory::Any,
          ParseOptions().withLanguageExtensions(
              LanguageExtensions().enable_extC_KandRStyle(true)));
}